

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType1Interpreter.cpp
# Opt level: O2

EStatusCode __thiscall
CharStringType1Interpreter::InterpretOperator
          (CharStringType1Interpreter *this,Byte inBuffer,
          InputCharStringDecodeStream *inCharStringToIntepret,bool *outGotEndExecutionCommand)

{
  int iVar1;
  uint uVar2;
  EStatusCode EVar3;
  undefined4 extraout_var;
  undefined7 in_register_00000031;
  Byte buffer;
  
  *outGotEndExecutionCommand = false;
  EVar3 = eFailure;
  if ((int)CONCAT71(in_register_00000031,inBuffer) == 0xc) {
    iVar1 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                      (inCharStringToIntepret,&buffer,1);
    if (CONCAT44(extraout_var,iVar1) != 1) {
      return eFailure;
    }
    uVar2 = buffer | 0xc00;
  }
  else {
    uVar2 = (uint)inBuffer;
  }
  switch(uVar2) {
  case 1:
    EVar3 = InterpretHStem(this);
    break;
  case 2:
  case 0xc:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
    break;
  case 3:
    EVar3 = InterpretVStem(this);
    break;
  case 4:
    EVar3 = InterpretVMoveto(this);
    break;
  case 5:
    EVar3 = InterpretRLineto(this);
    break;
  case 6:
    EVar3 = InterpretHLineto(this);
    break;
  case 7:
    EVar3 = InterpretVLineto(this);
    break;
  case 8:
    EVar3 = InterpretRRCurveto(this);
    break;
  case 9:
    EVar3 = InterpretClosePath(this);
    break;
  case 10:
    EVar3 = InterpretCallSubr(this);
    break;
  case 0xb:
    EVar3 = InterpretReturn(this);
    *outGotEndExecutionCommand = true;
    break;
  case 0xd:
    EVar3 = InterpretHsbw(this);
    break;
  case 0xe:
    EVar3 = InterpretEndChar(this);
    break;
  case 0x15:
    EVar3 = InterpretRMoveto(this);
    break;
  case 0x16:
    EVar3 = InterpretHMoveto(this);
    break;
  case 0x1e:
    EVar3 = InterpretVHCurveto(this);
    break;
  case 0x1f:
    EVar3 = InterpretHVCurveto(this);
    break;
  default:
    switch(uVar2) {
    case 0xc00:
      EVar3 = InterpretDotSection(this);
      break;
    case 0xc01:
      EVar3 = InterpretVStem3(this);
      break;
    case 0xc02:
      EVar3 = InterpretHStem3(this);
      break;
    case 0xc03:
    case 0xc04:
    case 0xc05:
    case 0xc08:
    case 0xc09:
    case 0xc0a:
    case 0xc0b:
    case 0xc0d:
    case 0xc0e:
    case 0xc0f:
      break;
    case 0xc06:
      EVar3 = InterpretSeac(this);
      break;
    case 0xc07:
      EVar3 = InterpretSbw(this);
      break;
    case 0xc0c:
      EVar3 = InterpretDiv(this);
      break;
    case 0xc10:
      EVar3 = InterpretCallOtherSubr(this);
      break;
    case 0xc11:
      EVar3 = InterpretPop(this);
      break;
    default:
      if (uVar2 == 0xc21) {
        EVar3 = InterpretSetCurrentPoint(this);
      }
    }
  }
  return EVar3;
}

Assistant:

EStatusCode CharStringType1Interpreter::InterpretOperator(Byte inBuffer,InputCharStringDecodeStream* inCharStringToIntepret,bool& outGotEndExecutionCommand)
{
	EStatusCode status = eFailure;
	unsigned short operatorValue;
	outGotEndExecutionCommand = false;
	Byte buffer;
	
	if(12 == inBuffer)
	{
		if(inCharStringToIntepret->Read(&buffer,1) != 1)
			return eFailure;

		operatorValue = 0x0c00 + buffer;
	}
	else
	{
		operatorValue = inBuffer;
	}

	switch(operatorValue)
	{
		case 1: // hstem
			status = InterpretHStem();
			break;
		case 3: // vstem
			status = InterpretVStem();
			break;
		case 4: // vmoveto
			status = InterpretVMoveto();
			break;
		case 5: // rlineto
			status = InterpretRLineto();
			break;
		case 6: // hlineto
			status = InterpretHLineto();
			break;
		case 7: // vlineto
			status = InterpretVLineto();
			break;
		case 8: // rrcurveto
			status = InterpretRRCurveto();
			break;
		case 9: // closepath
			status = InterpretClosePath();
			break;
		case 10: // callsubr
			status = InterpretCallSubr();
			break;
		case 11: // return
			status = InterpretReturn();
			outGotEndExecutionCommand = true;
			break;
		case 13: // hsbw
			status = InterpretHsbw();
			break;
		case 14: // endchar
			status = InterpretEndChar();
			break;
		case 21: // rmoveto
			status = InterpretRMoveto();
			break;
		case 22: // hmoveto
			status = InterpretHMoveto();
			break;
		case 30: // vhcurveto
			status = InterpretVHCurveto();
			break;
		case 31: // hvcurveto
			status = InterpretHVCurveto();
			break;
		
		case 0x0c00: // dotsection
			status = InterpretDotSection();
			break;
		case 0x0c01: // vstem3
			status = InterpretVStem3();
			break;
		case 0x0c02: // hstem3
			status = InterpretHStem3();
			break;
		case 0x0c06: // seac
			status = InterpretSeac();
			break;
		case 0x0c07: // sbw
			status = InterpretSbw();
			break;
		case 0x0c0c: // div
			status = InterpretDiv();
			break;
		case 0x0c10: // callothersubr
			status = InterpretCallOtherSubr();
			break;
		case 0x0c11: // pop
			status = InterpretPop();
			break;
		case 0x0c21: // setcurrentpoint
			status = InterpretSetCurrentPoint();
			break;
	}
	return status;	
}